

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluate.c
# Opt level: O2

symbol * integer_promotion(dmr_C *C,symbol *type)

{
  ulong uVar1;
  anon_union_136_3_e2189aaa_for_symbol_15 *paVar2;
  
  paVar2 = &type->field_14;
  if (*(char *)type == '\r') {
    type = (type->field_14).field_2.ctype.base_type;
  }
  if ((paVar2->field_1).normal < C->target->bits_in_int) {
    type = &C->S->int_ctype;
  }
  else {
    uVar1 = (type->field_14).field_2.ctype.modifiers;
    if ((uVar1 & 0x300) != 0) {
      if ((char)uVar1 < '\0') {
        type = &C->S->uint_ctype;
      }
      else {
        type = &C->S->int_ctype;
      }
    }
  }
  return type;
}

Assistant:

static inline struct symbol *integer_promotion(struct dmr_C *C, struct symbol *type)
{
	unsigned long mod =  type->ctype.modifiers;
	int width = type->bit_size;

	/*
	 * Bitfields always promote to the base type,
	 * even if the bitfield might be bigger than
	 * an "int".
	 */
	if (type->type == SYM_BITFIELD) {
		type = type->ctype.base_type;
	}
	mod = type->ctype.modifiers;
	if (width < C->target->bits_in_int)
		return &C->S->int_ctype;

	/* If char/short has as many bits as int, it still gets "promoted" */
	if (mod & (MOD_CHAR | MOD_SHORT)) {
		if (mod & MOD_UNSIGNED)
			return &C->S->uint_ctype;
		return &C->S->int_ctype;
	}
	return type;
}